

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distance.cpp
# Opt level: O3

double Distance::getGeodesicDistance(PhyloTree *t1,PhyloTree *t2,bool normalise)

{
  double dVar1;
  double dVar2;
  double local_68;
  Geodesic local_58;
  
  Geodesic::getGeodesic(&local_58,t1,t2);
  local_68 = Geodesic::getDist(&local_58);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_58.commonEdges);
  std::vector<Ratio,_std::allocator<Ratio>_>::~vector(&local_58.rs._RatioSequence);
  if (normalise) {
    dVar1 = PhyloTree::getDistanceFromOrigin(t1);
    dVar2 = PhyloTree::getDistanceFromOrigin(t2);
    local_68 = local_68 / (dVar1 + dVar2);
  }
  return local_68;
}

Assistant:

double Distance::getGeodesicDistance(PhyloTree &t1, PhyloTree &t2, bool normalise) {
    try {
        double distance = Geodesic::getGeodesic(t1, t2).getDist();
        if (normalise) return distance / (t1.getDistanceFromOrigin() + t2.getDistanceFromOrigin());
        return distance;
    } catch (std::invalid_argument &e) {
        std::cout << "ERROR! " << e.what() << std::endl;
        return std::numeric_limits<double>::infinity();
    }
}